

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_primitive_field.cc
# Opt level: O0

void google::protobuf::compiler::java::anon_unknown_3::SetPrimitiveVariables
               (FieldDescriptor *descriptor,int messageBitIndex,int builderBitIndex,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar1;
  bool bVar2;
  JavaType JVar3;
  int field_number;
  Type TVar4;
  mapped_type *pmVar5;
  char *pcVar6;
  mapped_type *this;
  FieldOptions *this_00;
  Descriptor *descriptor_00;
  int bitIndex;
  int bitIndex_00;
  int bitIndex_01;
  int bitIndex_02;
  int bitIndex_03;
  int bitIndex_04;
  int bitIndex_05;
  int bitIndex_06;
  int bitIndex_07;
  int bitIndex_08;
  int bitIndex_09;
  int bitIndex_10;
  undefined4 in_register_00000014;
  FieldDescriptor *field;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  FieldDescriptor *field_02;
  allocator<char> local_861;
  key_type local_860;
  string local_840;
  allocator<char> local_819;
  key_type local_818;
  string local_7f8;
  allocator<char> local_7d1;
  key_type local_7d0;
  string local_7b0;
  allocator<char> local_789;
  key_type local_788;
  string local_768;
  allocator<char> local_741;
  key_type local_740;
  string local_720;
  allocator<char> local_6f9;
  key_type local_6f8;
  string local_6d8;
  allocator<char> local_6b1;
  key_type local_6b0;
  string local_690;
  allocator<char> local_669;
  key_type local_668;
  string local_648;
  allocator<char> local_621;
  key_type local_620;
  string local_600;
  allocator<char> local_5d9;
  key_type local_5d8;
  string local_5b8;
  allocator<char> local_591;
  key_type local_590;
  string local_570;
  allocator<char> local_549;
  key_type local_548;
  string local_528;
  allocator<char> local_501;
  key_type local_500;
  allocator<char> local_4d9;
  key_type local_4d8;
  string local_4b8 [32];
  int local_498;
  allocator<char> local_491;
  int fixed_size;
  allocator<char> local_469;
  key_type local_468;
  allocator<char> local_441;
  key_type local_440;
  allocator<char> local_419;
  key_type local_418;
  string local_3f8 [39];
  allocator<char> local_3d1;
  key_type local_3d0;
  string local_3b0 [39];
  allocator<char> local_389;
  key_type local_388;
  allocator<char> local_361;
  key_type local_360;
  byte local_339;
  string local_338;
  byte local_312;
  allocator<char> local_311;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  allocator<char> local_2e9;
  key_type local_2e8;
  string local_2c8;
  allocator<char> local_2a1;
  key_type local_2a0;
  allocator<char> local_279;
  key_type local_278;
  allocator<char> local_251;
  key_type local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  allocator<char> local_1e9;
  key_type local_1e8;
  allocator<char> local_1c1;
  key_type local_1c0;
  allocator<char> local_199;
  key_type local_198;
  allocator<char> local_171;
  key_type local_170;
  allocator<char> local_149;
  key_type local_148;
  string local_128 [39];
  allocator<char> local_101;
  key_type local_100;
  string local_e0;
  allocator<char> local_b9;
  key_type local_b8;
  string local_98;
  allocator<char> local_61;
  key_type local_60;
  string local_40;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_20;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables_local;
  int builderBitIndex_local;
  int messageBitIndex_local;
  FieldDescriptor *descriptor_local;
  
  local_20 = variables;
  variables_local._0_4_ = builderBitIndex;
  variables_local._4_4_ = messageBitIndex;
  _builderBitIndex_local = descriptor;
  UnderscoresToCamelCase_abi_cxx11_
            (&local_40,(java *)descriptor,
             (FieldDescriptor *)CONCAT44(in_register_00000014,builderBitIndex));
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"name",&local_61);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_60);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  std::__cxx11::string::~string((string *)&local_40);
  UnderscoresToCapitalizedCamelCase_abi_cxx11_(&local_98,(java *)_builderBitIndex_local,field);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"capitalized_name",&local_b9);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_b8);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::__cxx11::string::~string((string *)&local_98);
  FieldConstantName_abi_cxx11_(&local_e0,(java *)_builderBitIndex_local,field_00);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"constant_name",&local_101);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_100);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  std::__cxx11::string::~string((string *)&local_e0);
  FieldDescriptor::number(_builderBitIndex_local);
  google::protobuf::SimpleItoa_abi_cxx11_((int)local_128);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"number",&local_149);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_148);
  std::__cxx11::string::operator=((string *)pmVar5,local_128);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  std::__cxx11::string::~string(local_128);
  JVar3 = GetJavaType(_builderBitIndex_local);
  pcVar6 = PrimitiveTypeName(JVar3);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"type",&local_171);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_170);
  std::__cxx11::string::operator=((string *)pmVar5,pcVar6);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator(&local_171);
  JVar3 = GetJavaType(_builderBitIndex_local);
  pcVar6 = BoxedPrimitiveTypeName(JVar3);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"boxed_type",&local_199);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_198);
  std::__cxx11::string::operator=((string *)pmVar5,pcVar6);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"type",&local_1c1);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_1c0);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"field_type",&local_1e9);
  this = std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator[](pmVar1,&local_1e8);
  std::__cxx11::string::operator=((string *)this,(string *)pmVar5);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"boxed_type",&local_251);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_250);
  std::operator+(&local_230,"java.util.List<",pmVar5);
  std::operator+(&local_210,&local_230,">");
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_278,"field_list_type",&local_279);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_278);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_210);
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator(&local_279);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator(&local_251);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"empty_list",&local_2a1);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_2a0);
  std::__cxx11::string::operator=((string *)pmVar5,"java.util.Collections.emptyList()");
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  DefaultValue_abi_cxx11_(&local_2c8,(java *)_builderBitIndex_local,field_01);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"default",&local_2e9);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_2e8);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  std::__cxx11::string::~string((string *)&local_2c8);
  bVar2 = IsDefaultValueJavaDefault(_builderBitIndex_local);
  local_312 = 0;
  local_339 = 0;
  if (bVar2) {
    std::allocator<char>::allocator();
    local_312 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"",&local_311);
  }
  else {
    DefaultValue_abi_cxx11_(&local_338,(java *)_builderBitIndex_local,field_02);
    local_339 = 1;
    std::operator+(&local_310,"= ",&local_338);
  }
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_360,"default_init",&local_361)
  ;
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_360);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_310);
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator(&local_361);
  std::__cxx11::string::~string((string *)&local_310);
  if ((local_339 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_338);
  }
  if ((local_312 & 1) != 0) {
    std::allocator<char>::~allocator(&local_311);
  }
  pcVar6 = GetCapitalizedType(_builderBitIndex_local);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_388,"capitalized_type",&local_389);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_388);
  std::__cxx11::string::operator=((string *)pmVar5,pcVar6);
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator(&local_389);
  internal::WireFormat::MakeTag(_builderBitIndex_local);
  google::protobuf::SimpleItoa_abi_cxx11_((uint)local_3b0);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d0,"tag",&local_3d1);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_3d0);
  std::__cxx11::string::operator=((string *)pmVar5,local_3b0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::allocator<char>::~allocator(&local_3d1);
  std::__cxx11::string::~string(local_3b0);
  field_number = FieldDescriptor::number(_builderBitIndex_local);
  TVar4 = GetType(_builderBitIndex_local);
  internal::WireFormat::TagSize(field_number,TVar4);
  google::protobuf::SimpleItoa_abi_cxx11_((int)local_3f8);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_418,"tag_size",&local_419);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_418);
  std::__cxx11::string::operator=((string *)pmVar5,local_3f8);
  std::__cxx11::string::~string((string *)&local_418);
  std::allocator<char>::~allocator(&local_419);
  std::__cxx11::string::~string(local_3f8);
  JVar3 = GetJavaType(_builderBitIndex_local);
  bVar2 = IsReferenceType(JVar3);
  pmVar1 = local_20;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_440,"null_check",&local_441)
    ;
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_440);
    std::__cxx11::string::operator=
              ((string *)pmVar5,
               "  if (value == null) {\n    throw new NullPointerException();\n  }\n");
    std::__cxx11::string::~string((string *)&local_440);
    std::allocator<char>::~allocator(&local_441);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_468,"null_check",&local_469)
    ;
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_468);
    std::__cxx11::string::operator=((string *)pmVar5,"");
    std::__cxx11::string::~string((string *)&local_468);
    std::allocator<char>::~allocator(&local_469);
  }
  this_00 = FieldDescriptor::options(_builderBitIndex_local);
  bVar2 = FieldOptions::deprecated(this_00);
  pmVar1 = local_20;
  pcVar6 = "";
  if (bVar2) {
    pcVar6 = "@java.lang.Deprecated ";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&fixed_size,"deprecation",&local_491)
  ;
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,(key_type *)&fixed_size);
  std::__cxx11::string::operator=((string *)pmVar5,pcVar6);
  std::__cxx11::string::~string((string *)&fixed_size);
  std::allocator<char>::~allocator(&local_491);
  TVar4 = GetType(_builderBitIndex_local);
  local_498 = FixedSize(TVar4);
  if (local_498 != -1) {
    google::protobuf::SimpleItoa_abi_cxx11_((int)local_4b8);
    pmVar1 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d8,"fixed_size",&local_4d9)
    ;
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_4d8);
    std::__cxx11::string::operator=((string *)pmVar5,local_4b8);
    std::__cxx11::string::~string((string *)&local_4d8);
    std::allocator<char>::~allocator(&local_4d9);
    std::__cxx11::string::~string(local_4b8);
  }
  descriptor_00 = FieldDescriptor::containing_type(_builderBitIndex_local);
  bVar2 = HasDescriptorMethods(descriptor_00);
  pmVar1 = local_20;
  pcVar6 = "";
  if (bVar2) {
    pcVar6 = "onChanged();";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_500,"on_changed",&local_501);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_500);
  std::__cxx11::string::operator=((string *)pmVar5,pcVar6);
  std::__cxx11::string::~string((string *)&local_500);
  std::allocator<char>::~allocator(&local_501);
  GenerateGetBit_abi_cxx11_(&local_528,(java *)(ulong)variables_local._4_4_,bitIndex);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_548,"get_has_field_bit_message",&local_549);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_548);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_528);
  std::__cxx11::string::~string((string *)&local_548);
  std::allocator<char>::~allocator(&local_549);
  std::__cxx11::string::~string((string *)&local_528);
  GenerateSetBit_abi_cxx11_(&local_570,(java *)(ulong)variables_local._4_4_,bitIndex_00);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_590,"set_has_field_bit_message",&local_591);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_590);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_570);
  std::__cxx11::string::~string((string *)&local_590);
  std::allocator<char>::~allocator(&local_591);
  std::__cxx11::string::~string((string *)&local_570);
  GenerateGetBit_abi_cxx11_(&local_5b8,(java *)(ulong)(uint)variables_local,bitIndex_01);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5d8,"get_has_field_bit_builder",&local_5d9);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_5d8);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_5b8);
  std::__cxx11::string::~string((string *)&local_5d8);
  std::allocator<char>::~allocator(&local_5d9);
  std::__cxx11::string::~string((string *)&local_5b8);
  GenerateSetBit_abi_cxx11_(&local_600,(java *)(ulong)(uint)variables_local,bitIndex_02);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_620,"set_has_field_bit_builder",&local_621);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_620);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_600);
  std::__cxx11::string::~string((string *)&local_620);
  std::allocator<char>::~allocator(&local_621);
  std::__cxx11::string::~string((string *)&local_600);
  GenerateClearBit_abi_cxx11_(&local_648,(java *)(ulong)(uint)variables_local,bitIndex_03);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_668,"clear_has_field_bit_builder",&local_669);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_668);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_648);
  std::__cxx11::string::~string((string *)&local_668);
  std::allocator<char>::~allocator(&local_669);
  std::__cxx11::string::~string((string *)&local_648);
  GenerateGetBit_abi_cxx11_(&local_690,(java *)(ulong)(uint)variables_local,bitIndex_04);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6b0,"get_mutable_bit_builder",&local_6b1);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_6b0);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_690);
  std::__cxx11::string::~string((string *)&local_6b0);
  std::allocator<char>::~allocator(&local_6b1);
  std::__cxx11::string::~string((string *)&local_690);
  GenerateSetBit_abi_cxx11_(&local_6d8,(java *)(ulong)(uint)variables_local,bitIndex_05);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6f8,"set_mutable_bit_builder",&local_6f9);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_6f8);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_6d8);
  std::__cxx11::string::~string((string *)&local_6f8);
  std::allocator<char>::~allocator(&local_6f9);
  std::__cxx11::string::~string((string *)&local_6d8);
  GenerateClearBit_abi_cxx11_(&local_720,(java *)(ulong)(uint)variables_local,bitIndex_06);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_740,"clear_mutable_bit_builder",&local_741);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_740);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_720);
  std::__cxx11::string::~string((string *)&local_740);
  std::allocator<char>::~allocator(&local_741);
  std::__cxx11::string::~string((string *)&local_720);
  GenerateGetBitMutableLocal_abi_cxx11_(&local_768,(java *)(ulong)(uint)variables_local,bitIndex_07)
  ;
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_788,"get_mutable_bit_parser",&local_789);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_788);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_768);
  std::__cxx11::string::~string((string *)&local_788);
  std::allocator<char>::~allocator(&local_789);
  std::__cxx11::string::~string((string *)&local_768);
  GenerateSetBitMutableLocal_abi_cxx11_(&local_7b0,(java *)(ulong)(uint)variables_local,bitIndex_08)
  ;
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7d0,"set_mutable_bit_parser",&local_7d1);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_7d0);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_7b0);
  std::__cxx11::string::~string((string *)&local_7d0);
  std::allocator<char>::~allocator(&local_7d1);
  std::__cxx11::string::~string((string *)&local_7b0);
  GenerateGetBitFromLocal_abi_cxx11_(&local_7f8,(java *)(ulong)(uint)variables_local,bitIndex_09);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_818,"get_has_field_bit_from_local",&local_819);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_818);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_7f8);
  std::__cxx11::string::~string((string *)&local_818);
  std::allocator<char>::~allocator(&local_819);
  std::__cxx11::string::~string((string *)&local_7f8);
  GenerateSetBitToLocal_abi_cxx11_(&local_840,(java *)(ulong)variables_local._4_4_,bitIndex_10);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_860,"set_has_field_bit_to_local",&local_861);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_860);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_840);
  std::__cxx11::string::~string((string *)&local_860);
  std::allocator<char>::~allocator(&local_861);
  std::__cxx11::string::~string((string *)&local_840);
  return;
}

Assistant:

void SetPrimitiveVariables(const FieldDescriptor* descriptor,
                           int messageBitIndex,
                           int builderBitIndex,
                           map<string, string>* variables) {
  (*variables)["name"] =
    UnderscoresToCamelCase(descriptor);
  (*variables)["capitalized_name"] =
    UnderscoresToCapitalizedCamelCase(descriptor);
  (*variables)["constant_name"] = FieldConstantName(descriptor);
  (*variables)["number"] = SimpleItoa(descriptor->number());
  (*variables)["type"] = PrimitiveTypeName(GetJavaType(descriptor));
  (*variables)["boxed_type"] = BoxedPrimitiveTypeName(GetJavaType(descriptor));
  (*variables)["field_type"] = (*variables)["type"];
  (*variables)["field_list_type"] = "java.util.List<" +
      (*variables)["boxed_type"] + ">";
  (*variables)["empty_list"] = "java.util.Collections.emptyList()";
  (*variables)["default"] = DefaultValue(descriptor);
  (*variables)["default_init"] = IsDefaultValueJavaDefault(descriptor) ?
      "" : ("= " + DefaultValue(descriptor));
  (*variables)["capitalized_type"] = GetCapitalizedType(descriptor);
  (*variables)["tag"] = SimpleItoa(WireFormat::MakeTag(descriptor));
  (*variables)["tag_size"] = SimpleItoa(
      WireFormat::TagSize(descriptor->number(), GetType(descriptor)));
  if (IsReferenceType(GetJavaType(descriptor))) {
    (*variables)["null_check"] =
        "  if (value == null) {\n"
        "    throw new NullPointerException();\n"
        "  }\n";
  } else {
    (*variables)["null_check"] = "";
  }
  // TODO(birdo): Add @deprecated javadoc when generating javadoc is supported
  // by the proto compiler
  (*variables)["deprecation"] = descriptor->options().deprecated()
      ? "@java.lang.Deprecated " : "";
  int fixed_size = FixedSize(GetType(descriptor));
  if (fixed_size != -1) {
    (*variables)["fixed_size"] = SimpleItoa(fixed_size);
  }
  (*variables)["on_changed"] =
      HasDescriptorMethods(descriptor->containing_type()) ? "onChanged();" : "";

  // For singular messages and builders, one bit is used for the hasField bit.
  (*variables)["get_has_field_bit_message"] = GenerateGetBit(messageBitIndex);
  (*variables)["set_has_field_bit_message"] = GenerateSetBit(messageBitIndex);

  (*variables)["get_has_field_bit_builder"] = GenerateGetBit(builderBitIndex);
  (*variables)["set_has_field_bit_builder"] = GenerateSetBit(builderBitIndex);
  (*variables)["clear_has_field_bit_builder"] =
      GenerateClearBit(builderBitIndex);

  // For repated builders, one bit is used for whether the array is immutable.
  (*variables)["get_mutable_bit_builder"] = GenerateGetBit(builderBitIndex);
  (*variables)["set_mutable_bit_builder"] = GenerateSetBit(builderBitIndex);
  (*variables)["clear_mutable_bit_builder"] = GenerateClearBit(builderBitIndex);

  // For repeated fields, one bit is used for whether the array is immutable
  // in the parsing constructor.
  (*variables)["get_mutable_bit_parser"] =
      GenerateGetBitMutableLocal(builderBitIndex);
  (*variables)["set_mutable_bit_parser"] =
      GenerateSetBitMutableLocal(builderBitIndex);

  (*variables)["get_has_field_bit_from_local"] =
      GenerateGetBitFromLocal(builderBitIndex);
  (*variables)["set_has_field_bit_to_local"] =
      GenerateSetBitToLocal(messageBitIndex);
}